

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall
gl4cts::CopyImage::FunctionalTest::prepareTestCases
          (FunctionalTest *this,GLenum dst_internal_format,GLenum dst_target,
          GLenum src_internal_format,GLenum src_target)

{
  pointer *pptVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLenum internal_format;
  long lVar4;
  GLuint *pGVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  testCase *ptVar9;
  iterator iVar10;
  byte bVar11;
  testCase test_case;
  GLuint local_cc;
  GLuint local_c8;
  GLuint local_c4;
  GLuint local_c0;
  GLuint local_bc;
  GLenum local_b8;
  GLenum local_b4;
  GLuint local_b0;
  GLenum local_ac;
  GLenum local_a8;
  GLenum local_a4;
  GLenum local_a0;
  GLuint local_9c;
  vector<gl4cts::CopyImage::FunctionalTest::testCase,std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>>
  *local_98;
  testCase local_90;
  long local_40;
  long local_38;
  
  bVar11 = 0;
  local_bc = 3;
  if ((int)dst_target < 0x9100) {
    if ((dst_target == 0x84f5) || (dst_target == 0x8d41)) {
LAB_0088737a:
      local_bc = 1;
    }
  }
  else if ((dst_target == 0x9102) || (dst_target == 0x9100)) goto LAB_0088737a;
  local_c0 = 3;
  if ((int)src_target < 0x9100) {
    if ((src_target != 0x84f5) && (src_target != 0x8d41)) goto LAB_008873c5;
  }
  else if ((src_target != 0x9102) && (src_target != 0x9100)) goto LAB_008873c5;
  local_c0 = 1;
LAB_008873c5:
  local_b8 = dst_internal_format;
  local_b4 = src_internal_format;
  local_a0 = Utils::getFormat(dst_internal_format);
  local_a4 = Utils::getType(dst_internal_format);
  internal_format = local_b4;
  local_a8 = Utils::getFormat(local_b4);
  local_ac = Utils::getType(internal_format);
  local_98 = (vector<gl4cts::CopyImage::FunctionalTest::testCase,std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>>
              *)&this->m_test_cases;
  local_cc = 0;
  do {
    local_c8 = 0;
    do {
      lVar4 = 0;
      do {
        local_40 = lVar4;
        GVar2 = prepareTestCases::image_dimmensions[lVar4];
        lVar4 = 0;
        do {
          GVar3 = prepareTestCases::image_dimmensions[lVar4];
          local_38 = lVar4;
          lVar8 = 0;
          do {
            local_90.m_width = *(GLuint *)((long)prepareTestCases::region_dimmensions + lVar8);
            local_9c = 0;
            local_c4 = 0;
            local_b0 = 0;
            uVar7 = GVar3 - local_90.m_width;
            if (uVar7 == 1) {
              local_c4 = 1;
              pGVar5 = &local_c4;
            }
            else {
              pGVar5 = &local_9c;
              if (GVar3 != local_90.m_width) {
                local_c4 = uVar7 >> 1;
                local_b0 = uVar7;
                pGVar5 = &local_b0;
              }
            }
            local_90.m_dst.m_target = dst_target;
            local_90.m_dst.m_width = GVar3;
            local_90.m_dst.m_height = GVar3;
            local_90.m_dst.m_level = local_c8;
            local_90.m_dst.m_internal_format = local_b8;
            local_90.m_dst.m_format = local_a0;
            local_90.m_dst.m_type = local_a4;
            local_90.m_dst_x = 0;
            local_90.m_dst_y = 0;
            local_90.m_src.m_target = src_target;
            local_90.m_src.m_width = GVar2;
            local_90.m_src.m_height = GVar2;
            local_90.m_src.m_level = local_cc;
            local_90.m_src.m_internal_format = local_b4;
            local_90.m_src.m_format = local_a8;
            local_90.m_src.m_type = local_ac;
            local_90.m_src_x = 0;
            local_90.m_src_y = 0;
            local_90.m_height = local_90.m_width;
            local_90.m_dst_y = *pGVar5;
            local_90.m_dst_x = *pGVar5;
            local_90.m_src_x = 0;
            local_90.m_src_y = 0;
            iVar10._M_current =
                 (this->m_test_cases).
                 super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (this->m_test_cases).
                super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<gl4cts::CopyImage::FunctionalTest::testCase,std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>>
              ::_M_realloc_insert<gl4cts::CopyImage::FunctionalTest::testCase_const&>
                        (local_98,iVar10,&local_90);
            }
            else {
              ptVar9 = &local_90;
              for (lVar6 = 0x14; lVar6 != 0; lVar6 = lVar6 + -1) {
                ((iVar10._M_current)->m_dst).m_target = (ptVar9->m_dst).m_target;
                ptVar9 = (testCase *)((long)ptVar9 + (ulong)bVar11 * -8 + 4);
                iVar10._M_current = iVar10._M_current + (ulong)bVar11 * -8 + 4;
              }
              pptVar1 = &(this->m_test_cases).
                         super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pptVar1 = *pptVar1 + 1;
            }
            if (lVar4 != 0 && GVar3 == GVar2) {
              local_90.m_dst_x = 0;
              local_90.m_dst_y = 0;
              local_90.m_src_x = 0;
              local_90.m_src_y = 0;
              local_90.m_width = GVar3;
              local_90.m_height = GVar3;
              iVar10._M_current =
                   (this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar10._M_current ==
                  (this->m_test_cases).
                  super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<gl4cts::CopyImage::FunctionalTest::testCase,std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>>
                ::_M_realloc_insert<gl4cts::CopyImage::FunctionalTest::testCase_const&>
                          (local_98,iVar10,&local_90);
              }
              else {
                ptVar9 = &local_90;
                for (lVar6 = 0x14; lVar6 != 0; lVar6 = lVar6 + -1) {
                  ((iVar10._M_current)->m_dst).m_target = (ptVar9->m_dst).m_target;
                  ptVar9 = (testCase *)((long)ptVar9 + (ulong)bVar11 * -8 + 4);
                  iVar10._M_current = iVar10._M_current + (ulong)bVar11 * -8 + 4;
                }
                pptVar1 = &(this->m_test_cases).
                           super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *pptVar1 = *pptVar1 + 1;
              }
            }
            lVar8 = lVar8 + 4;
          } while (lVar8 == 4);
          lVar4 = local_38 + 1;
        } while (local_38 == 0);
        lVar4 = local_40 + 1;
      } while (local_40 == 0);
      local_c8 = local_c8 + 1;
    } while (local_c8 != local_bc);
    local_cc = local_cc + 1;
  } while (local_cc != local_c0);
  return;
}

Assistant:

void FunctionalTest::prepareTestCases(GLenum dst_internal_format, GLenum dst_target, GLenum src_internal_format,
									  GLenum src_target)
{
	static const GLuint image_dimmensions[] = {
		7,
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_IMG_DIM
		8,
		9,
		10,
		11,
		12,
		13,
		14,
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_IMG_DIM */
		15
	};

	static const GLuint region_dimmensions[] = {
		1,
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_DIM
		2,
		3,
		4,
		5,
		6,
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_DIM */
		7
	};

	static const GLuint n_image_dimmensions  = sizeof(image_dimmensions) / sizeof(image_dimmensions[0]);
	static const GLuint n_region_dimmensions = sizeof(region_dimmensions) / sizeof(region_dimmensions[0]);

	const bool   is_dst_multi_level = Utils::isTargetMultilevel(dst_target);
	const bool   is_src_multi_level = Utils::isTargetMultilevel(src_target);
	const GLenum dst_format			= Utils::getFormat(dst_internal_format);
	const GLuint dst_n_levels		= (true == is_dst_multi_level) ? FUNCTIONAL_TEST_N_LEVELS : 1;
	const GLenum dst_type			= Utils::getType(dst_internal_format);
	const GLenum src_format			= Utils::getFormat(src_internal_format);
	const GLuint src_n_levels		= (true == is_src_multi_level) ? FUNCTIONAL_TEST_N_LEVELS : 1;
	const GLenum src_type			= Utils::getType(src_internal_format);

	for (GLuint src_level = 0; src_level < src_n_levels; ++src_level)
	{
		for (GLuint dst_level = 0; dst_level < dst_n_levels; ++dst_level)
		{
			for (GLuint src_img_dim_id = 0; src_img_dim_id < n_image_dimmensions; ++src_img_dim_id)
			{
				const GLuint src_image_dimmension = image_dimmensions[src_img_dim_id];

				for (GLuint dst_img_dim_id = 0; dst_img_dim_id < n_image_dimmensions; ++dst_img_dim_id)
				{
					const GLuint dst_image_dimmension = image_dimmensions[dst_img_dim_id];

					for (GLuint reg_dim_id = 0; reg_dim_id < n_region_dimmensions; ++reg_dim_id)
					{
						const GLuint region_dimmension = region_dimmensions[reg_dim_id];
						GLuint		 dst_coord[3]	  = { 0, 0, 0 };
						const GLuint dst_dim_diff	  = dst_image_dimmension - region_dimmension;
						GLuint		 n_dst_coords	  = 1;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
						GLuint n_src_coords = 1;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						GLuint		 src_coord[3] = { 0, 0, 0 };
						const GLuint src_dim_diff = src_image_dimmension - region_dimmension;

						/* Calculate coords */
						if (1 == dst_dim_diff)
						{
							dst_coord[1] = 1;
							n_dst_coords = 2;
						}
						else if (1 < dst_dim_diff)
						{
							dst_coord[1] = dst_dim_diff / 2;
							dst_coord[2] = dst_dim_diff;
							n_dst_coords = 3;
						}

						if (1 == src_dim_diff)
						{
							src_coord[1] = 1;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
							n_src_coords = 2;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						}
						else if (1 < src_dim_diff)
						{
							src_coord[1] = src_dim_diff / 2;
							src_coord[2] = src_dim_diff;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
							n_src_coords = 3;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						}

						testCase test_case = {
							{									/* m_dst */
							  dst_target, dst_image_dimmension, /* width */
							  dst_image_dimmension,				/* height */
							  dst_level, dst_internal_format, dst_format, dst_type },
							0,									/* dst_x */
							0,									/* dst_y */
							{									/* m_src */
							  src_target, src_image_dimmension, /* width */
							  src_image_dimmension,				/* height */
							  src_level, src_internal_format, src_format, src_type },
							0,				   /* src_x */
							0,				   /* src_y */
							region_dimmension, /* width */
							region_dimmension, /* height */
						};

#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
						for (GLuint src_x = 0; src_x < n_src_coords; ++src_x)
						{
							for (GLuint src_y = 0; src_y < n_src_coords; ++src_y)
							{
								for (GLuint dst_x = 0; dst_x < n_dst_coords; ++dst_x)
								{
									for (GLuint dst_y = 0; dst_y < n_dst_coords; ++dst_y)
									{
										test_case.m_dst_x = dst_coord[dst_x];
										test_case.m_dst_y = dst_coord[dst_y];
										test_case.m_src_x = src_coord[src_x];
										test_case.m_src_y = src_coord[src_y];

										m_test_cases.push_back(test_case);
									}
								}
							}
						}
#else  /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						test_case.m_dst_x = dst_coord[n_dst_coords - 1];
						test_case.m_dst_y = dst_coord[n_dst_coords - 1];
						test_case.m_src_x = src_coord[0];
						test_case.m_src_y = src_coord[0];

						m_test_cases.push_back(test_case);
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */

						/* Whole image, for non 7x7 */
						if ((dst_image_dimmension == src_image_dimmension) &&
							(image_dimmensions[0] != dst_image_dimmension))
						{
							test_case.m_dst_x  = 0;
							test_case.m_dst_y  = 0;
							test_case.m_src_x  = 0;
							test_case.m_src_y  = 0;
							test_case.m_width  = dst_image_dimmension;
							test_case.m_height = dst_image_dimmension;

							m_test_cases.push_back(test_case);
						}
					}
				}
			}
		}
	}
}